

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool tinyobj::exportGroupsToShape
               (shape_t *shape,PrimGroup *prim_group,
               vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *tags,int material_id,
               string *name,bool triangulate,vector<float,_std::allocator<float>_> *v)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  vector<int,_std::allocator<int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  lines_t *this_02;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  pointer pvVar8;
  pointer pfVar9;
  undefined4 uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  pointer pfVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  pointer p_Var24;
  pointer p_Var25;
  ulong uVar26;
  pointer pvVar27;
  pointer p_Var28;
  pointer p_Var29;
  long lVar30;
  ulong uVar31;
  size_t j;
  mesh_t *pmVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined7 in_register_00000089;
  vertex_index_t *pvVar36;
  size_t k;
  long lVar37;
  ulong uVar38;
  long lVar39;
  size_t i;
  size_t j_1;
  pointer pfVar40;
  face_t *pfVar41;
  shape_t *psVar42;
  bool bVar43;
  float fVar44;
  real_t rVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 extraout_var [56];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  long lStack_110;
  uchar local_102;
  byte local_101;
  mesh_t *local_100;
  int material_id_local;
  shape_t *local_f0;
  face_t *local_e8;
  uint local_e0;
  float local_dc;
  vertex_index_t ind [3];
  real_t vx [3];
  value_type local_90;
  value_type local_84;
  value_type local_78;
  real_t vy [3];
  face_t remainingFace;
  
  uVar22 = CONCAT71(in_register_00000089,triangulate) & 0xffffffff;
  material_id_local = material_id;
  local_f0 = shape;
  local_101 = PrimGroup::IsEmpty(prim_group);
  psVar42 = local_f0;
  if (!(bool)local_101) {
    auVar56._0_8_ = std::__cxx11::string::_M_assign((string *)local_f0);
    auVar56._8_56_ = extraout_var;
    pfVar40 = (prim_group->faceGroup).
              super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    pfVar19 = (prim_group->faceGroup).
              super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pfVar40 != pfVar19) {
      local_100 = &psVar42->mesh;
      local_e0 = (uint)CONCAT71(in_register_00000089,triangulate);
      this = &(psVar42->mesh).num_face_vertices;
      this_00 = &(psVar42->mesh).material_ids;
      this_01 = &(psVar42->mesh).smoothing_group_ids;
      for (uVar35 = 0; uVar35 < (ulong)((long)pfVar19 - (long)pfVar40 >> 5); uVar35 = uVar35 + 1) {
        pvVar8 = pfVar40[uVar35].vertex_indices.
                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar20 = ((long)pfVar40[uVar35].vertex_indices.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8) / 0xc;
        if (2 < uVar20) {
          pfVar41 = pfVar40 + uVar35;
          if ((char)uVar22 != '\0') {
            pfVar9 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar33 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pfVar9 >> 2;
            uVar22 = 1;
            pvVar27 = pvVar8;
            while (-uVar20 + uVar22 != 1) {
              lVar37 = (long)pvVar27->v_idx;
              uVar26 = uVar22 + 1;
              if (lVar37 * 3 + 2U < uVar33) {
                if (uVar22 == uVar20) {
                  uVar22 = 0;
                }
                lVar21 = (long)pvVar8[uVar22].v_idx;
                if ((lVar21 * 3 + 2U < uVar33) &&
                   (lVar30 = (long)pvVar8[uVar26 % uVar20].v_idx, lVar30 * 3 + 2U < uVar33)) {
                  fVar44 = pfVar9[lVar21 * 3 + 1] - pfVar9[lVar37 * 3 + 1];
                  fVar11 = pfVar9[lVar21 * 3 + 2] - pfVar9[lVar37 * 3 + 2];
                  fVar12 = pfVar9[lVar21 * 3] - pfVar9[lVar37 * 3];
                  fVar13 = pfVar9[lVar30 * 3] - pfVar9[lVar21 * 3];
                  fVar14 = pfVar9[lVar30 * 3 + 1] - pfVar9[lVar21 * 3 + 1];
                  fVar15 = pfVar9[lVar30 * 3 + 2] - pfVar9[lVar21 * 3 + 2];
                  auVar57._8_4_ = 0x7fffffff;
                  auVar57._0_8_ = 0x7fffffff7fffffff;
                  auVar57._12_4_ = 0x7fffffff;
                  auVar54 = vfmsub231ss_fma(ZEXT416((uint)(fVar13 * fVar44)),ZEXT416((uint)fVar12),
                                            ZEXT416((uint)fVar14));
                  auVar53 = vfmsub231ss_fma(ZEXT416((uint)(fVar11 * fVar14)),ZEXT416((uint)fVar44),
                                            ZEXT416((uint)fVar15));
                  auVar46 = vfmsub231ss_fma(ZEXT416((uint)(fVar15 * fVar12)),ZEXT416((uint)fVar13),
                                            ZEXT416((uint)fVar11));
                  auVar54 = vandps_avx(auVar54,auVar57);
                  auVar53 = vandps_avx(auVar53,auVar57);
                  auVar56 = ZEXT1664(auVar53);
                  auVar46 = vandps_avx(auVar46,auVar57);
                  fVar44 = auVar53._0_4_;
                  if ((1.1920929e-07 < auVar54._0_4_) ||
                     ((1.1920929e-07 < fVar44 || (1.1920929e-07 < auVar46._0_4_)))) {
                    if (auVar54._0_4_ < fVar44) {
                      lStack_110 = 1;
                      lVar37 = lStack_110;
                      lStack_110 = 2;
                      if (auVar46._0_4_ < fVar44) goto LAB_00e5d227;
                    }
                    uVar16 = vcmpps_avx512vl(auVar53,auVar54,1);
                    uVar17 = vcmpps_avx512vl(auVar46,auVar54,1);
                    lStack_110 = 2 - (ulong)((uint)uVar16 & (uint)uVar17 & 1);
                    lVar37 = 0;
                    goto LAB_00e5d227;
                  }
                }
              }
              pvVar27 = pvVar27 + 1;
              uVar22 = uVar26;
            }
            lVar37 = 1;
            lStack_110 = 2;
LAB_00e5d227:
            auVar54 = ZEXT816(0) << 0x40;
            uVar22 = 0;
LAB_00e5d22d:
            auVar55 = auVar56._0_32_;
            pvVar27 = pvVar8 + uVar22;
            do {
              uVar22 = uVar22 + 1;
              if (-uVar20 + uVar22 == 1) {
                local_dc = auVar54._0_4_;
                local_e8 = pfVar41;
                face_t::face_t(&remainingFace,pfVar41);
                auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
                auVar56 = ZEXT3264(auVar55);
                ind[2].vn_idx = -1;
                ind[0].v_idx = auVar55._0_4_;
                ind[0]._4_8_ = auVar55._4_8_;
                ind[1].v_idx = auVar55._12_4_;
                ind[1]._4_8_ = auVar55._16_8_;
                ind[2].v_idx = auVar55._24_4_;
                ind[2].vt_idx = auVar55._28_4_;
                uVar20 = ((long)(pfVar41->vertex_indices).
                                super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pfVar41->vertex_indices).
                               super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0xc;
                uVar33 = 0;
                uVar22 = ((long)remainingFace.vertex_indices.
                                super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)remainingFace.vertex_indices.
                               super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0xc;
                goto LAB_00e5d31c;
              }
              uVar26 = 0;
              if (uVar22 != uVar20) {
                uVar26 = uVar22;
              }
              lVar21 = (long)pvVar27->v_idx * 3;
              uVar34 = lVar21 + lVar37;
              if ((uVar34 < uVar33) && (uVar31 = lVar21 + lStack_110, uVar31 < uVar33)) {
                lVar21 = (long)pvVar8[uVar26].v_idx * 3;
                uVar26 = lVar21 + lVar37;
                if ((uVar26 < uVar33) && (uVar38 = lVar21 + lStack_110, uVar38 < uVar33))
                goto LAB_00e5d28f;
              }
              pvVar27 = pvVar27 + 1;
            } while( true );
          }
          lVar37 = 4;
          uVar22 = uVar20;
          while (bVar43 = uVar22 != 0, uVar22 = uVar22 - 1, bVar43) {
            pvVar8 = (pfVar41->vertex_indices).
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ind[0].v_idx = *(int *)((long)pvVar8 + lVar37 + -4);
            auVar46._8_8_ = 0;
            auVar46._0_8_ = *(ulong *)((long)&pvVar8->v_idx + lVar37);
            auVar54 = vpshufd_avx(auVar46,0xe1);
            auVar56 = ZEXT1664(auVar54);
            ind[0]._4_8_ = auVar54._0_8_;
            std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                      (&local_100->indices,(value_type *)ind);
            lVar37 = lVar37 + 0xc;
          }
          ind[0].v_idx = CONCAT31(ind[0].v_idx._1_3_,(char)uVar20);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (this,(uchar *)ind);
          std::vector<int,_std::allocator<int>_>::push_back(this_00,&material_id_local);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (this_01,&pfVar41->smoothing_group_id);
          uVar22 = (ulong)local_e0;
          psVar42 = local_f0;
        }
LAB_00e5d71f:
        pfVar40 = (prim_group->faceGroup).
                  super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pfVar19 = (prim_group->faceGroup).
                  super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::operator=
                (&(psVar42->mesh).tags,tags);
    }
    p_Var28 = (prim_group->lineGroup).
              super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    p_Var24 = (prim_group->lineGroup).
              super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (p_Var28 != p_Var24) {
      this_02 = &local_f0->lines;
      local_e8 = (face_t *)&(local_f0->lines).num_line_vertices;
      pmVar32 = (mesh_t *)0x0;
      while (pmVar32 < (undefined1 *)(((long)p_Var24 - (long)p_Var28) / 0x18)) {
        lVar37 = 4;
        uVar22 = 0;
        local_100 = pmVar32;
        while( true ) {
          pvVar8 = p_Var28[(long)pmVar32].vertex_indices.
                   super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar35 = ((long)p_Var28[(long)pmVar32].vertex_indices.
                          super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8) / 0xc;
          if (uVar35 <= uVar22) break;
          ind[0].v_idx = *(int *)((long)pvVar8 + lVar37 + -4);
          auVar53._8_8_ = 0;
          auVar53._0_8_ = *(ulong *)((long)&pvVar8->v_idx + lVar37);
          auVar54 = vpshufd_avx(auVar53,0xe1);
          ind[0]._4_8_ = auVar54._0_8_;
          std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                    (&this_02->indices,(value_type *)ind);
          p_Var28 = (prim_group->lineGroup).
                    super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar22 = uVar22 + 1;
          lVar37 = lVar37 + 0xc;
        }
        ind[0].v_idx = (int)uVar35;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)local_e8,&ind[0].v_idx);
        p_Var28 = (prim_group->lineGroup).
                  super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        p_Var24 = (prim_group->lineGroup).
                  super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pmVar32 = (mesh_t *)
                  ((long)&(local_100->indices).
                          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                          _M_impl.super__Vector_impl_data._M_start + 1);
      }
    }
    p_Var29 = (prim_group->pointsGroup).
              super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    p_Var25 = (prim_group->pointsGroup).
              super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (p_Var29 != p_Var25) {
      local_f0 = (shape_t *)&local_f0->points;
      for (uVar22 = 0; uVar22 < (ulong)(((long)p_Var25 - (long)p_Var29) / 0x18); uVar22 = uVar22 + 1
          ) {
        lVar37 = 4;
        uVar35 = 0;
        while( true ) {
          pvVar8 = p_Var29[uVar22].vertex_indices.
                   super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)p_Var29[uVar22].vertex_indices.
                             super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8) / 0xc) <=
              uVar35) break;
          ind[0].v_idx = *(int *)((long)pvVar8 + lVar37 + -4);
          auVar54._8_8_ = 0;
          auVar54._0_8_ = *(ulong *)((long)&pvVar8->v_idx + lVar37);
          auVar54 = vpshufd_avx(auVar54,0xe1);
          ind[0]._4_8_ = auVar54._0_8_;
          std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                    ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)local_f0,
                     (value_type *)ind);
          p_Var29 = (prim_group->pointsGroup).
                    super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar35 = uVar35 + 1;
          lVar37 = lVar37 + 0xc;
        }
        p_Var25 = (prim_group->pointsGroup).
                  super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
    }
  }
  return (bool)(local_101 ^ 1);
LAB_00e5d31c:
  pvVar8 = remainingFace.vertex_indices.
           super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>.
           _M_impl.super__Vector_impl_data._M_start;
  psVar42 = local_f0;
  lVar21 = (long)remainingFace.vertex_indices.
                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)remainingFace.vertex_indices.
                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar26 = lVar21 / 0xc;
  pfVar9 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar34 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pfVar9 >> 2;
  while( true ) {
    auVar54 = auVar56._0_16_;
    if ((uVar26 < 4) || (uVar20 == 0)) {
      uVar22 = (ulong)local_e0;
      if (lVar21 == 0x24) {
        uVar1 = pvVar8->vt_idx;
        uVar4 = pvVar8->vn_idx;
        auVar50._4_4_ = uVar4;
        auVar50._0_4_ = uVar1;
        auVar50._8_8_ = 0;
        local_78.vertex_index = pvVar8->v_idx;
        local_84.vertex_index = pvVar8[1].v_idx;
        local_90.vertex_index = pvVar8[2].v_idx;
        auVar54 = vshufps_avx(auVar50,auVar50,0xe1);
        local_78._4_8_ = vmovlps_avx(auVar54);
        uVar2 = pvVar8[1].vt_idx;
        uVar5 = pvVar8[1].vn_idx;
        auVar51._4_4_ = uVar5;
        auVar51._0_4_ = uVar2;
        auVar51._8_8_ = 0;
        auVar54 = vshufps_avx(auVar51,auVar51,0xe1);
        local_84._4_8_ = vmovlps_avx(auVar54);
        uVar3 = pvVar8[2].vt_idx;
        uVar6 = pvVar8[2].vn_idx;
        auVar52._4_4_ = uVar6;
        auVar52._0_4_ = uVar3;
        auVar52._8_8_ = 0;
        auVar54 = vpshufd_avx(auVar52,0xe1);
        local_90._4_8_ = auVar54._0_8_;
        std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                  (&local_100->indices,&local_78);
        pfVar41 = local_e8;
        std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                  (&local_100->indices,&local_84);
        std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                  (&local_100->indices,&local_90);
        local_102 = '\x03';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (this,&local_102);
        std::vector<int,_std::allocator<int>_>::push_back(this_00,&material_id_local);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (this_01,&pfVar41->smoothing_group_id);
      }
      auVar56 = ZEXT1664(auVar54);
      std::_Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
      ~_Vector_base(&remainingFace.vertex_indices.
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                   );
      goto LAB_00e5d71f;
    }
    pvVar36 = ind;
    uVar31 = uVar26;
    if (uVar33 < uVar26) {
      uVar31 = 0;
    }
    uVar33 = uVar33 - uVar31;
    for (lVar30 = 0; lVar30 != 3; lVar30 = lVar30 + 1) {
      uVar31 = (uVar33 + lVar30) % uVar26;
      pvVar36->vn_idx = pvVar8[uVar31].vn_idx;
      uVar7 = pvVar8[uVar31].v_idx;
      uVar10 = pvVar8[uVar31].vt_idx;
      pvVar36->v_idx = uVar7;
      pvVar36->vt_idx = uVar10;
      uVar31 = (long)(int)uVar7 * 3 + lVar37;
      if ((uVar31 < uVar34) && (uVar38 = (long)(int)uVar7 * 3 + lStack_110, uVar38 < uVar34)) {
        vx[lVar30] = pfVar9[uVar31];
        rVar45 = pfVar9[uVar38];
      }
      else {
        vx[lVar30] = 0.0;
        rVar45 = 0.0;
      }
      vy[lVar30] = rVar45;
      pvVar36 = pvVar36 + 1;
    }
    uVar20 = uVar20 - 1;
    if (uVar22 != uVar26) {
      uVar20 = uVar26;
    }
    auVar54 = vfmsub213ss_fma(ZEXT416((uint)(vy[2] - vy[1])),ZEXT416((uint)(vx[1] - vx[0])),
                              ZEXT416((uint)((vx[2] - vx[1]) * (vy[1] - vy[0]))));
    fVar44 = local_dc * auVar54._0_4_;
    uVar22 = uVar26;
    if (0.0 <= fVar44) break;
LAB_00e5d42e:
    auVar56 = ZEXT464((uint)fVar44);
    uVar33 = uVar33 + 1;
  }
  for (uVar31 = 3; uVar31 != uVar26; uVar31 = uVar31 + 1) {
    lVar30 = (long)pvVar8[(uVar31 + uVar33) % uVar26].v_idx * 3;
    uVar38 = lVar30 + lVar37;
    if ((uVar38 < uVar34) && (uVar23 = lVar30 + lStack_110, uVar23 < uVar34)) {
      fVar44 = pfVar9[uVar38];
      fVar11 = pfVar9[uVar23];
      bVar43 = false;
      lVar30 = 2;
      for (lVar39 = 0; lVar39 != 3; lVar39 = lVar39 + 1) {
        fVar12 = vy[lVar39];
        uVar16 = vcmpps_avx512vl(ZEXT416((uint)fVar11),ZEXT416((uint)vy[lVar30]),5);
        uVar17 = vcmpps_avx512vl(ZEXT416((uint)fVar11),ZEXT416((uint)fVar12),1);
        if (((((ushort)uVar17 ^ (ushort)uVar16) & 1) == 0) &&
           (fVar44 < vx[lVar39] +
                     ((fVar11 - fVar12) * (vx[lVar30] - vx[lVar39])) / (vy[lVar30] - fVar12))) {
          bVar43 = !bVar43;
        }
        lVar30 = lVar39;
      }
      if (bVar43) goto LAB_00e5d42e;
    }
  }
  auVar47._8_8_ = 0;
  auVar47._0_4_ = ind[0].vt_idx;
  auVar47._4_4_ = ind[0].vn_idx;
  local_78.vertex_index = ind[0].v_idx;
  local_84.vertex_index = ind[1].v_idx;
  auVar54 = vshufps_avx(auVar47,auVar47,0xe1);
  local_78._4_8_ = vmovlps_avx(auVar54);
  auVar48._8_8_ = 0;
  auVar48._0_4_ = ind[1].vt_idx;
  auVar48._4_4_ = ind[1].vn_idx;
  local_90.vertex_index = ind[2].v_idx;
  auVar54 = vshufps_avx(auVar48,auVar48,0xe1);
  local_84._4_8_ = vmovlps_avx(auVar54);
  auVar49._4_4_ = ind[2].vn_idx;
  auVar49._0_4_ = ind[2].vt_idx;
  auVar49._8_8_ = 0;
  auVar54 = vpshufd_avx(auVar49,0xe1);
  local_90._4_8_ = auVar54._0_8_;
  auVar56 = ZEXT1664(auVar54);
  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
            (&local_100->indices,&local_78);
  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
            (&local_100->indices,&local_84);
  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
            (&local_100->indices,&local_90);
  local_102 = '\x03';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this,&local_102);
  std::vector<int,_std::allocator<int>_>::push_back(this_00,&material_id_local);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (this_01,&local_e8->smoothing_group_id);
  uVar34 = (uVar33 + 1) % uVar26;
  while (uVar31 = uVar34 + 1, uVar31 < uVar26) {
    remainingFace.vertex_indices.
    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>._M_impl.
    super__Vector_impl_data._M_start[uVar34].vn_idx =
         remainingFace.vertex_indices.
         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar31].vn_idx;
    iVar18 = remainingFace.vertex_indices.
             super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar31].vt_idx;
    remainingFace.vertex_indices.
    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>._M_impl.
    super__Vector_impl_data._M_start[uVar34].v_idx =
         remainingFace.vertex_indices.
         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar31].v_idx;
    remainingFace.vertex_indices.
    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>._M_impl.
    super__Vector_impl_data._M_start[uVar34].vt_idx = iVar18;
    uVar34 = uVar31;
  }
  remainingFace.vertex_indices.
  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>._M_impl.
  super__Vector_impl_data._M_finish =
       remainingFace.vertex_indices.
       super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>._M_impl
       .super__Vector_impl_data._M_finish + -1;
  goto LAB_00e5d31c;
LAB_00e5d28f:
  auVar56 = ZEXT464((uint)pfVar9[uVar34]);
  auVar53 = vfmsub231ss_fma(ZEXT416((uint)(pfVar9[uVar26] * pfVar9[uVar31])),
                            ZEXT416((uint)pfVar9[uVar34]),ZEXT416((uint)pfVar9[uVar38]));
  auVar54 = vfmadd231ss_fma(auVar54,auVar53,ZEXT416(0x3f000000));
  goto LAB_00e5d22d;
}

Assistant:

static bool exportGroupsToShape(shape_t *shape, const PrimGroup &prim_group,
                                const std::vector<tag_t> &tags,
                                const int material_id, const std::string &name,
                                bool triangulate,
                                const std::vector<real_t> &v) {
  if (prim_group.IsEmpty()) {
    return false;
  }

  shape->name = name;

  // polygon
  if (!prim_group.faceGroup.empty()) {
    // Flatten vertices and indices
    for (size_t i = 0; i < prim_group.faceGroup.size(); i++) {
      const face_t &face = prim_group.faceGroup[i];

      size_t npolys = face.vertex_indices.size();

      if (npolys < 3) {
        // Face must have 3+ vertices.
        continue;
      }

      vertex_index_t i0 = face.vertex_indices[0];
      vertex_index_t i1(-1);
      vertex_index_t i2 = face.vertex_indices[1];

      if (triangulate) {
        // find the two axes to work in
        size_t axes[2] = {1, 2};
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          i2 = face.vertex_indices[(k + 2) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          size_t vi2 = size_t(i2.v_idx);

          if (((3 * vi0 + 2) >= v.size()) || ((3 * vi1 + 2) >= v.size()) ||
              ((3 * vi2 + 2) >= v.size())) {
            // Invalid triangle.
            // FIXME(syoyo): Is it ok to simply skip this invalid triangle?
            continue;
          }
          real_t v0x = v[vi0 * 3 + 0];
          real_t v0y = v[vi0 * 3 + 1];
          real_t v0z = v[vi0 * 3 + 2];
          real_t v1x = v[vi1 * 3 + 0];
          real_t v1y = v[vi1 * 3 + 1];
          real_t v1z = v[vi1 * 3 + 2];
          real_t v2x = v[vi2 * 3 + 0];
          real_t v2y = v[vi2 * 3 + 1];
          real_t v2z = v[vi2 * 3 + 2];
          real_t e0x = v1x - v0x;
          real_t e0y = v1y - v0y;
          real_t e0z = v1z - v0z;
          real_t e1x = v2x - v1x;
          real_t e1y = v2y - v1y;
          real_t e1z = v2z - v1z;
          real_t cx = std::fabs(e0y * e1z - e0z * e1y);
          real_t cy = std::fabs(e0z * e1x - e0x * e1z);
          real_t cz = std::fabs(e0x * e1y - e0y * e1x);
          const real_t epsilon = std::numeric_limits<real_t>::epsilon();
          if (cx > epsilon || cy > epsilon || cz > epsilon) {
            // found a corner
            if (cx > cy && cx > cz) {
            } else {
              axes[0] = 0;
              if (cz > cx && cz > cy) axes[1] = 1;
            }
            break;
          }
        }

        real_t area = 0;
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          if (((vi0 * 3 + axes[0]) >= v.size()) ||
              ((vi0 * 3 + axes[1]) >= v.size()) ||
              ((vi1 * 3 + axes[0]) >= v.size()) ||
              ((vi1 * 3 + axes[1]) >= v.size())) {
            // Invalid index.
            continue;
          }
          real_t v0x = v[vi0 * 3 + axes[0]];
          real_t v0y = v[vi0 * 3 + axes[1]];
          real_t v1x = v[vi1 * 3 + axes[0]];
          real_t v1y = v[vi1 * 3 + axes[1]];
          area += (v0x * v1y - v0y * v1x) * static_cast<real_t>(0.5);
        }

        face_t remainingFace = face;  // copy
        size_t guess_vert = 0;
        vertex_index_t ind[3];
        real_t vx[3];
        real_t vy[3];

        // How many iterations can we do without decreasing the remaining
        // vertices.
        size_t remainingIterations = face.vertex_indices.size();
        size_t previousRemainingVertices = remainingFace.vertex_indices.size();

        while (remainingFace.vertex_indices.size() > 3 &&
               remainingIterations > 0) {
          npolys = remainingFace.vertex_indices.size();
          if (guess_vert >= npolys) {
            guess_vert -= npolys;
          }

          if (previousRemainingVertices != npolys) {
            // The number of remaining vertices decreased. Reset counters.
            previousRemainingVertices = npolys;
            remainingIterations = npolys;
          } else {
            // We didn't consume a vertex on previous iteration, reduce the
            // available iterations.
            remainingIterations--;
          }

          for (size_t k = 0; k < 3; k++) {
            ind[k] = remainingFace.vertex_indices[(guess_vert + k) % npolys];
            size_t vi = size_t(ind[k].v_idx);
            if (((vi * 3 + axes[0]) >= v.size()) ||
                ((vi * 3 + axes[1]) >= v.size())) {
              // ???
              vx[k] = static_cast<real_t>(0.0);
              vy[k] = static_cast<real_t>(0.0);
            } else {
              vx[k] = v[vi * 3 + axes[0]];
              vy[k] = v[vi * 3 + axes[1]];
            }
          }
          real_t e0x = vx[1] - vx[0];
          real_t e0y = vy[1] - vy[0];
          real_t e1x = vx[2] - vx[1];
          real_t e1y = vy[2] - vy[1];
          real_t cross = e0x * e1y - e0y * e1x;
          // if an internal angle
          if (cross * area < static_cast<real_t>(0.0)) {
            guess_vert += 1;
            continue;
          }

          // check all other verts in case they are inside this triangle
          bool overlap = false;
          for (size_t otherVert = 3; otherVert < npolys; ++otherVert) {
            size_t idx = (guess_vert + otherVert) % npolys;

            if (idx >= remainingFace.vertex_indices.size()) {
              // ???
              continue;
            }

            size_t ovi = size_t(remainingFace.vertex_indices[idx].v_idx);

            if (((ovi * 3 + axes[0]) >= v.size()) ||
                ((ovi * 3 + axes[1]) >= v.size())) {
              // ???
              continue;
            }
            real_t tx = v[ovi * 3 + axes[0]];
            real_t ty = v[ovi * 3 + axes[1]];
            if (pnpoly(3, vx, vy, tx, ty)) {
              overlap = true;
              break;
            }
          }

          if (overlap) {
            guess_vert += 1;
            continue;
          }

          // this triangle is an ear
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = ind[0].v_idx;
            idx0.normal_index = ind[0].vn_idx;
            idx0.texcoord_index = ind[0].vt_idx;
            idx1.vertex_index = ind[1].v_idx;
            idx1.normal_index = ind[1].vn_idx;
            idx1.texcoord_index = ind[1].vt_idx;
            idx2.vertex_index = ind[2].v_idx;
            idx2.normal_index = ind[2].vn_idx;
            idx2.texcoord_index = ind[2].vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }

          // remove v1 from the list
          size_t removed_vert_index = (guess_vert + 1) % npolys;
          while (removed_vert_index + 1 < npolys) {
            remainingFace.vertex_indices[removed_vert_index] =
                remainingFace.vertex_indices[removed_vert_index + 1];
            removed_vert_index += 1;
          }
          remainingFace.vertex_indices.pop_back();
        }

        if (remainingFace.vertex_indices.size() == 3) {
          i0 = remainingFace.vertex_indices[0];
          i1 = remainingFace.vertex_indices[1];
          i2 = remainingFace.vertex_indices[2];
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = i0.v_idx;
            idx0.normal_index = i0.vn_idx;
            idx0.texcoord_index = i0.vt_idx;
            idx1.vertex_index = i1.v_idx;
            idx1.normal_index = i1.vn_idx;
            idx1.texcoord_index = i1.vt_idx;
            idx2.vertex_index = i2.v_idx;
            idx2.normal_index = i2.vn_idx;
            idx2.texcoord_index = i2.vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }
        }
      } else {
        for (size_t k = 0; k < npolys; k++) {
          index_t idx;
          idx.vertex_index = face.vertex_indices[k].v_idx;
          idx.normal_index = face.vertex_indices[k].vn_idx;
          idx.texcoord_index = face.vertex_indices[k].vt_idx;
          shape->mesh.indices.push_back(idx);
        }

        shape->mesh.num_face_vertices.push_back(
            static_cast<unsigned char>(npolys));
        shape->mesh.material_ids.push_back(material_id);  // per face
        shape->mesh.smoothing_group_ids.push_back(
            face.smoothing_group_id);  // per face
      }
    }

    shape->mesh.tags = tags;
  }

  // line
  if (!prim_group.lineGroup.empty()) {
    // Flatten indices
    for (size_t i = 0; i < prim_group.lineGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.lineGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.lineGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->lines.indices.push_back(idx);
      }

      shape->lines.num_line_vertices.push_back(
          int(prim_group.lineGroup[i].vertex_indices.size()));
    }
  }

  // points
  if (!prim_group.pointsGroup.empty()) {
    // Flatten & convert indices
    for (size_t i = 0; i < prim_group.pointsGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.pointsGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.pointsGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->points.indices.push_back(idx);
      }
    }
  }

  return true;
}